

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int socket_server_listen(socket_server *ss,uintptr_t opaque,char *addr,int port,int backlog)

{
  int __fd;
  int iVar1;
  int iVar2;
  request_package request;
  request_package local_238;
  
  local_238.header[0] = '\0';
  local_238.header[1] = '\0';
  local_238.header[2] = '\0';
  local_238.header[3] = '\0';
  __fd = do_bind(addr,port,6,(int *)&local_238);
  iVar2 = -1;
  local_238.u.open.port = -1;
  if ((-1 < __fd) && (iVar1 = listen(__fd,backlog), local_238.u.open.port = __fd, iVar1 == -1)) {
    close(__fd);
    local_238.u.open.port = -1;
  }
  if (-1 < local_238.u.open.port) {
    iVar2 = reserve_id(ss);
    if (iVar2 < 0) {
      close(local_238.u.open.port);
    }
    else {
      local_238.u.open.id = iVar2;
      local_238.u.open.opaque = opaque;
      send_request(ss,&local_238,'L',0x18);
    }
  }
  return iVar2;
}

Assistant:

int 
socket_server_listen(struct socket_server *ss, uintptr_t opaque, const char * addr, int port, int backlog) {
	int fd = do_listen(addr, port, backlog);
	if (fd < 0) {
		return -1;
	}
	struct request_package request;
	int id = reserve_id(ss);
	if (id < 0) {
		close(fd);
		return id;
	}
	request.u.listen.opaque = opaque;
	request.u.listen.id = id;
	request.u.listen.fd = fd;
	send_request(ss, &request, 'L', sizeof(request.u.listen));
	return id;
}